

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O1

char RDL_checkGraphConnected(RDL_graph *gra)

{
  uint uVar1;
  char *visited;
  long lVar2;
  char cVar3;
  ulong __size;
  
  uVar1 = gra->V;
  __size = (ulong)uVar1;
  visited = (char *)malloc(__size);
  *visited = '\x01';
  if (1 < __size) {
    memset(visited + 1,0,(ulong)(uVar1 - 1));
  }
  RDL_DFSvisit(gra,0,visited);
  cVar3 = '\x01';
  if (__size != 0) {
    lVar2 = 0;
    do {
      if (visited[lVar2] == '\0') {
        cVar3 = '\0';
        break;
      }
      lVar2 = lVar2 + 1;
    } while (uVar1 != (uint)lVar2);
  }
  free(visited);
  return cVar3;
}

Assistant:

char RDL_checkGraphConnected(const RDL_graph *gra)
{
  unsigned i;
  char *visited;
  char result;
  result = 1;
  visited = malloc(gra->V * sizeof(*visited));
  visited[0] = 1; /*start vertex*/
  for(i=1; i<gra->V; ++i)
  {
    visited[i] = 0; /*unvisited*/
  }
  RDL_DFSvisit(gra, 0, visited);
  for(i=0; i<gra->V; ++i)
  {
    if(visited[i] == 0) /*one was unvisited*/
    {
      result = 0;
      break;
    }
  }

  free(visited);
  return result;
}